

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

Orphan<capnp::DynamicValue> * __thiscall
capnp::JsonCodec::Handler<capnp::Data,_(capnp::Style)1>::decodeBase
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,
          Handler<capnp::Data,_(capnp::Style)1> *this,JsonCodec *codec,Reader input,Type type,
          Orphanage orphanage)

{
  undefined8 in_R9;
  OrphanBuilder local_70;
  Builder local_50;
  
  (**(code **)(*(long *)this + 0x20))
            (&local_70,this,codec,orphanage.arena,orphanage.capTable,in_R9,
             input._reader.segment._0_4_,input._reader.capTable._0_4_,input._reader.data._0_4_,
             input._reader.pointers._0_4_,input._reader.dataSize,input._reader.nestingLimit);
  local_50.field_1.dataValue.super_ArrayPtr<unsigned_char> =
       capnp::_::OrphanBuilder::asData(&local_70);
  local_50.type = DATA;
  Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,&local_50,&local_70);
  DynamicValue::Builder::~Builder(&local_50);
  if (local_70.segment != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> decodeBase(const JsonCodec& codec, JsonValue::Reader input,
                                  Type type, Orphanage orphanage) const override final {
    return decode(codec, input, orphanage);
  }